

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

char * Wlc_PrsFindName(char *pStr,char **ppPlace)

{
  char cVar1;
  int iVar2;
  char *pStr_00;
  int iVar3;
  long lVar4;
  char *pStr_01;
  bool bVar5;
  
  *ppPlace = Wlc_PrsFindName::Buffer;
  pStr_00 = Wlc_PrsSkipSpaces(pStr);
  iVar2 = Wlc_PrsIsChar(pStr_00);
  iVar3 = 0;
  if (iVar2 == 0) {
    pStr_01 = (char *)0x0;
  }
  else {
    bVar5 = true;
    lVar4 = 0;
    while( true ) {
      pStr_01 = pStr_00 + lVar4;
      cVar1 = pStr_00[lVar4];
      if (cVar1 == '\0') break;
      if (bVar5) {
        iVar2 = Wlc_PrsIsChar(pStr_01);
        if (iVar2 == 0) break;
        if (cVar1 == '\\') {
LAB_0031136e:
          iVar3 = iVar3 + 1;
          bVar5 = false;
        }
        else {
          bVar5 = true;
        }
      }
      else {
        bVar5 = false;
        if (cVar1 == ' ') {
          iVar3 = iVar3 + -1;
          bVar5 = iVar3 == 0;
        }
        else if (cVar1 == '\\') goto LAB_0031136e;
      }
      Wlc_PrsFindName::Buffer[lVar4] = cVar1;
      lVar4 = lVar4 + 1;
    }
    Wlc_PrsFindName::Buffer[lVar4] = '\0';
  }
  return pStr_01;
}

Assistant:

static inline char * Wlc_PrsFindName( char * pStr, char ** ppPlace )
{
    static char Buffer[WLV_PRS_MAX_LINE];
    char * pThis = *ppPlace = Buffer;
    int fNotName = 1, Count = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( !Wlc_PrsIsChar(pStr) )
        return NULL;
//    while ( Wlc_PrsIsChar(pStr) )
//        *pThis++ = *pStr++;
    while ( *pStr )
    {
        if ( fNotName && !Wlc_PrsIsChar(pStr) )
            break;
        if ( *pStr == '\\' )
        {
            Count++;
            fNotName = 0;
        }
        else if ( !fNotName && *pStr == ' ' )
        {
            Count--;
            if ( !Count )
                fNotName = 1;
        }
        *pThis++ = *pStr++;
    }
    *pThis = 0;
    return pStr;
}